

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char> __thiscall
fmt::v11::detail::digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
          (digit_grouping<char> *this,basic_appender<char> out,basic_string_view<char> digits)

{
  char *begin;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int i;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> separators;
  basic_appender<char> local_840;
  char *local_838;
  next_state local_830;
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_> local_820;
  
  uVar2 = digits.size_;
  local_838 = digits.data_;
  local_820.super_buffer<int>.ptr_ = local_820.store_;
  local_820.super_buffer<int>.size_ = 0;
  local_820.super_buffer<int>.grow_ =
       basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::grow;
  local_820.super_buffer<int>.capacity_ = 500;
  local_830.group._M_current = local_830.group._M_current & 0xffffffff00000000;
  buffer<int>::push_back(&local_820.super_buffer<int>,(int *)&local_830);
  local_830.group._M_current = (this->grouping_)._M_dataplus._M_p;
  local_830.pos = 0;
  while( true ) {
    iVar1 = next(this,&local_830);
    local_840.container._0_4_ = iVar1;
    if ((iVar1 == 0) || ((int)digits.size_ <= iVar1)) break;
    buffer<int>::push_back(&local_820.super_buffer<int>,(int *)&local_840);
  }
  iVar1 = (int)local_820.super_buffer<int>.size_ + -1;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)digits.size_) {
    uVar3 = uVar2 & 0xffffffff;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((int)uVar2 == local_820.super_buffer<int>.ptr_[iVar1]) {
      begin = (this->thousands_sep_)._M_dataplus._M_p;
      buffer<char>::append<char>
                (out.container,begin,begin + (this->thousands_sep_)._M_string_length);
      iVar1 = iVar1 + -1;
    }
    local_840.container = out.container;
    basic_appender<char>::operator=(&local_840,local_838[uVar4]);
    uVar2 = (ulong)((int)uVar2 - 1);
  }
  basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::deallocate(&local_820);
  return (basic_appender<char>)out.container;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out = copy<Char>(thousands_sep_.data(),
                         thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }